

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ignorm.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  ostream *poVar5;
  vector<double,_std::allocator<double>_> *this;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_8;
  ostringstream error_message_7;
  vector<double,_std::allocator<double>_> generalized_cepstrum;
  int length;
  ostringstream error_message_6;
  GeneralizedCepstrumInverseGainNormalization generalized_cepstrum_inverse_gain_normalization;
  istream *input_stream;
  ostringstream error_message_5;
  ifstream ifs;
  ostringstream error_message_4;
  char *input_file;
  ostringstream error_message_3;
  int num_input_files;
  ostringstream error_message_2;
  int tmp;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  double gamma;
  int num_order;
  option *in_stack_ffffffffffffed28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffed30;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffed38;
  int in_stack_ffffffffffffed3c;
  GeneralizedCepstrumInverseGainNormalization *in_stack_ffffffffffffed40;
  undefined6 in_stack_ffffffffffffed48;
  undefined1 in_stack_ffffffffffffed4e;
  undefined1 in_stack_ffffffffffffed4f;
  ostream *in_stack_ffffffffffffed50;
  int *in_stack_ffffffffffffed60;
  undefined7 in_stack_ffffffffffffed68;
  vector<double,_std::allocator<double>_> *sequence_to_read;
  int in_stack_ffffffffffffed78;
  undefined4 in_stack_ffffffffffffed7c;
  int read_point;
  undefined8 in_stack_ffffffffffffed80;
  undefined7 in_stack_ffffffffffffed90;
  byte in_stack_ffffffffffffed97;
  char *local_1248;
  bool local_121a;
  byte local_11f2;
  bool local_11c2;
  allocator local_11a1;
  string local_11a0 [32];
  ostringstream local_1180 [152];
  ostringstream *in_stack_ffffffffffffef18;
  string *in_stack_ffffffffffffef20;
  undefined1 local_1001 [33];
  ostringstream local_fe0 [408];
  int local_e48;
  allocator local_e41;
  string local_e40 [32];
  ostringstream local_e20 [376];
  GeneralizedCepstrumInverseGainNormalization local_ca8;
  vector<double,_std::allocator<double>_> *local_c88;
  undefined4 local_c80;
  allocator local_c79;
  string local_c78 [32];
  ostringstream local_c58 [376];
  vector<double,_std::allocator<double>_> local_ae0 [21];
  allocator local_8d1;
  string local_8d0 [32];
  ostringstream local_8b0 [376];
  char *local_738;
  allocator local_729;
  string local_728 [32];
  ostringstream local_708 [376];
  int local_590;
  allocator local_589;
  string local_588 [32];
  ostringstream local_568 [383];
  allocator local_3e9;
  string local_3e8 [32];
  int local_3c8;
  allocator local_3c1;
  string local_3c0 [32];
  ostringstream local_3a0 [383];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [399];
  allocator local_49;
  string local_48 [36];
  int local_24;
  double local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_20 = 0.0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_24 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffed40 >> 0x20),
                                   (char **)CONCAT44(in_stack_ffffffffffffed3c,
                                                     in_stack_ffffffffffffed38),
                                   (char *)in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,
                                   (int *)0x10372b), pcVar1 = ya_optarg, local_24 != -1) {
    switch(local_24) {
    case 99:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e8,pcVar1,&local_3e9);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                         (int *)in_stack_ffffffffffffed30);
      local_121a = !bVar2 || local_3c8 < 1;
      std::__cxx11::string::~string(local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      if (local_121a) {
        std::__cxx11::ostringstream::ostringstream(local_568);
        std::operator<<((ostream *)local_568,
                        "The argument for the -c option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_588,"ignorm",&local_589);
        sptk::PrintErrorMessage(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
        std::__cxx11::string::~string(local_588);
        std::allocator<char>::~allocator((allocator<char> *)&local_589);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_568);
        return local_4;
      }
      local_20 = -1.0 / (double)local_3c8;
      break;
    default:
      anon_unknown.dwarf_1728::PrintUsage(in_stack_ffffffffffffed50);
      return 1;
    case 0x67:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,pcVar1,&local_221);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                         (double *)in_stack_ffffffffffffed30);
      local_11f2 = 1;
      if (bVar2) {
        bVar2 = sptk::IsValidGamma(local_20);
        local_11f2 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      if ((local_11f2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        std::operator<<((ostream *)local_3a0,"The argument for the -g option must be in [-1.0, 1.0]"
                       );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"ignorm",&local_3c1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_1728::PrintUsage(in_stack_ffffffffffffed50);
      return 0;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,pcVar1,&local_49);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                         (int *)in_stack_ffffffffffffed30);
      local_11c2 = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if (local_11c2) {
        std::__cxx11::ostringstream::ostringstream(local_1d8);
        poVar5 = std::operator<<((ostream *)local_1d8,"The argument for the -m option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,"ignorm",&local_1f9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d8);
        return local_4;
      }
    }
  }
  local_590 = local_8 - ya_optind;
  if (1 < local_590) {
    std::__cxx11::ostringstream::ostringstream(local_708);
    std::operator<<((ostream *)local_708,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_728,"ignorm",&local_729);
    sptk::PrintErrorMessage(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
    std::__cxx11::string::~string(local_728);
    std::allocator<char>::~allocator((allocator<char> *)&local_729);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_708);
    return local_4;
  }
  if (local_590 == 0) {
    local_1248 = (char *)0x0;
  }
  else {
    local_1248 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_738 = local_1248;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_8b0);
    std::operator<<((ostream *)local_8b0,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d0,"ignorm",&local_8d1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
    std::__cxx11::string::~string(local_8d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8b0);
    return local_4;
  }
  std::ifstream::ifstream(local_ae0);
  pcVar1 = local_738;
  if (local_738 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_ae0,(_Ios_Openmode)pcVar1);
    in_stack_ffffffffffffed97 = std::ios::fail();
    if ((in_stack_ffffffffffffed97 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_c58);
      poVar5 = std::operator<<((ostream *)local_c58,"Cannot open file ");
      std::operator<<(poVar5,local_738);
      paVar6 = &local_c79;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c78,"ignorm",paVar6);
      sptk::PrintErrorMessage(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
      std::__cxx11::string::~string(local_c78);
      std::allocator<char>::~allocator((allocator<char> *)&local_c79);
      local_4 = 1;
      local_c80 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_c58);
      goto LAB_00104868;
    }
  }
  bVar3 = std::ifstream::is_open();
  read_point = CONCAT13(bVar3,(int3)in_stack_ffffffffffffed7c);
  if ((bVar3 & 1) == 0) {
    sequence_to_read = (vector<double,_std::allocator<double>_> *)&std::cin;
  }
  else {
    sequence_to_read = local_ae0;
  }
  local_c88 = sequence_to_read;
  sptk::GeneralizedCepstrumInverseGainNormalization::GeneralizedCepstrumInverseGainNormalization
            (in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c,(double)in_stack_ffffffffffffed30);
  uVar4 = sptk::GeneralizedCepstrumInverseGainNormalization::IsValid(&local_ca8);
  if ((bool)uVar4) {
    local_e48 = local_14 + 1;
    this = (vector<double,_std::allocator<double>_> *)(long)local_e48;
    std::allocator<double>::allocator((allocator<double> *)0x1044e5);
    std::vector<double,_std::allocator<double>_>::vector
              (this,CONCAT17(in_stack_ffffffffffffed4f,
                             CONCAT16(in_stack_ffffffffffffed4e,in_stack_ffffffffffffed48)),
               (allocator_type *)in_stack_ffffffffffffed40);
    std::allocator<double>::~allocator((allocator<double> *)0x10450b);
    do {
      bVar2 = sptk::ReadStream<double>
                        (SUB81((ulong)in_stack_ffffffffffffed80 >> 0x30,0),
                         (int)in_stack_ffffffffffffed80,read_point,in_stack_ffffffffffffed78,
                         sequence_to_read,(istream *)CONCAT17(uVar4,in_stack_ffffffffffffed68),
                         (int *)CONCAT17(in_stack_ffffffffffffed97,in_stack_ffffffffffffed90));
      if (!bVar2) {
        local_4 = 0;
        local_c80 = 1;
        goto LAB_0010482c;
      }
      bVar2 = sptk::GeneralizedCepstrumInverseGainNormalization::Run
                        ((GeneralizedCepstrumInverseGainNormalization *)
                         CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                         in_stack_ffffffffffffed30);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_fe0);
        std::operator<<((ostream *)local_fe0,"Failed to denormalize generalized cepstrum");
        in_stack_ffffffffffffed40 = (GeneralizedCepstrumInverseGainNormalization *)local_1001;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_1001 + 1),"ignorm",(allocator *)in_stack_ffffffffffffed40);
        sptk::PrintErrorMessage(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
        std::__cxx11::string::~string((string *)(local_1001 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_1001);
        local_4 = 1;
        local_c80 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_fe0);
        goto LAB_0010482c;
      }
      bVar2 = sptk::WriteStream<double>
                        ((int)in_stack_ffffffffffffed80,read_point,sequence_to_read,
                         (ostream *)CONCAT17(uVar4,in_stack_ffffffffffffed68),
                         in_stack_ffffffffffffed60);
      in_stack_ffffffffffffed3c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffed3c);
    } while (bVar2);
    std::__cxx11::ostringstream::ostringstream(local_1180);
    std::operator<<((ostream *)local_1180,"Failed to write generalized cepstrum");
    paVar6 = &local_11a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11a0,"ignorm",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
    std::__cxx11::string::~string(local_11a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
    local_4 = 1;
    local_c80 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1180);
LAB_0010482c:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed40);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_e20);
    std::operator<<((ostream *)local_e20,
                    "Failed to initialize GeneralizedCepstrumInverseGainNormalization");
    paVar6 = &local_e41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e40,"ignorm",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
    std::__cxx11::string::~string(local_e40);
    std::allocator<char>::~allocator((allocator<char> *)&local_e41);
    local_4 = 1;
    local_c80 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e20);
  }
  sptk::GeneralizedCepstrumInverseGainNormalization::~GeneralizedCepstrumInverseGainNormalization
            (&local_ca8);
LAB_00104868:
  std::ifstream::~ifstream(local_ae0);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  double gamma(kDefaultGamma);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:g:c:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("ignorm", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &gamma) ||
            !sptk::IsValidGamma(gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("ignorm", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("ignorm", error_message);
          return 1;
        }
        gamma = -1.0 / tmp;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("ignorm", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ignorm", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("ignorm", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::GeneralizedCepstrumInverseGainNormalization
      generalized_cepstrum_inverse_gain_normalization(num_order, gamma);
  if (!generalized_cepstrum_inverse_gain_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize GeneralizedCepstrumInverseGainNormalization";
    sptk::PrintErrorMessage("ignorm", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> generalized_cepstrum(length);

  while (sptk::ReadStream(false, 0, 0, length, &generalized_cepstrum,
                          &input_stream, NULL)) {
    if (!generalized_cepstrum_inverse_gain_normalization.Run(
            &generalized_cepstrum)) {
      std::ostringstream error_message;
      error_message << "Failed to denormalize generalized cepstrum";
      sptk::PrintErrorMessage("ignorm", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, generalized_cepstrum, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write generalized cepstrum";
      sptk::PrintErrorMessage("ignorm", error_message);
      return 1;
    }
  }

  return 0;
}